

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

JavascriptFunction * __thiscall
Js::ScriptContext::GenerateRootFunction
          (ScriptContext *this,ParseNodeProg *parseTree,uint sourceIndex,Parser *parser,
          uint32 grfscr,CompileScriptException *pse,char16 *rootDisplayName)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  HRESULT HVar4;
  Utf8SourceInfo *pUVar5;
  LPCUTF8 puVar6;
  undefined4 *puVar7;
  ScriptFunction *pSVar8;
  ParseableFunctionInfo *local_40;
  ParseableFunctionInfo *body;
  
  pUVar5 = GetSource(this,sourceIndex);
  puVar6 = Utf8SourceInfo::GetSource(pUVar5,L"ScriptContext::GenerateRootFunction");
  if (puVar6 == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    body._4_4_ = sourceIndex;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xa3d,"(source != nullptr)","source != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    sourceIndex = body._4_4_;
  }
  local_40 = (ParseableFunctionInfo *)0x0;
  HVar4 = GenerateByteCode(parseTree,grfscr,this,&local_40,sourceIndex,false,parser,pse,
                           (ScopeInfo *)0x0,(ScriptFunction **)0x0);
  pUVar5 = GetSource(this,sourceIndex);
  pUVar5->byteCodeGenerationFlags = grfscr;
  if (HVar4 < 0) {
    pSVar8 = (ScriptFunction *)0x0;
  }
  else {
    ParseableFunctionInfo::SetDisplayName(local_40,rootDisplayName);
    puVar1 = &(local_40->super_FunctionProxy).field_0x44;
    *puVar1 = *puVar1 | 2;
    pSVar8 = JavascriptLibrary::CreateScriptFunction
                       ((this->super_ScriptContextBase).javascriptLibrary,
                        &local_40->super_FunctionProxy);
  }
  return (JavascriptFunction *)pSVar8;
}

Assistant:

JavascriptFunction* ScriptContext::GenerateRootFunction(ParseNodeProg * parseTree, uint sourceIndex, Parser* parser, uint32 grfscr, CompileScriptException * pse, const char16 *rootDisplayName)
    {
        HRESULT hr;

        // Get the source code to keep it alive during the bytecode generation process
        LPCUTF8 source = this->GetSource(sourceIndex)->GetSource(_u("ScriptContext::GenerateRootFunction"));
        Assert(source != nullptr); // Source should not have been reclaimed by now

        // Generate bytecode and native code
        ParseableFunctionInfo* body = NULL;
        hr = GenerateByteCode(parseTree, grfscr, this, &body, sourceIndex, false, parser, pse);

        this->GetSource(sourceIndex)->SetByteCodeGenerationFlags(grfscr);
        if(FAILED(hr))
        {
            return nullptr;
        }

        body->SetDisplayName(rootDisplayName);
        body->SetIsTopLevel(true);

        JavascriptFunction* rootFunction = javascriptLibrary->CreateScriptFunction(body);
        return rootFunction;
    }